

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

void vera::image(TextureStream *_stream)

{
  Shader *pSVar1;
  DefaultShaders _type;
  DefaultShaders _type_00;
  allocator local_161;
  string local_160;
  mat<4,_4,_float,_(glm::qualifier)0> local_13c;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  TextureStream *local_10;
  TextureStream *_stream_local;
  
  local_10 = _stream;
  if (billboard_shader == (Shader *)0x0) {
    pSVar1 = (Shader *)operator_new(0x100);
    Shader::Shader(pSVar1);
    billboard_shader = pSVar1;
    getDefaultSrc_abi_cxx11_(&local_40,(vera *)0x7,_type);
    getDefaultSrc_abi_cxx11_(&local_60,(vera *)0x6,_type_00);
    Shader::setSource(pSVar1,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  Shader::use(billboard_shader);
  pSVar1 = billboard_shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"u_depth",&local_81);
  Shader::setUniform(pSVar1,&local_80,0.0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pSVar1 = billboard_shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"u_scale",&local_a9);
  Shader::setUniform(pSVar1,&local_a8,1.0,1.0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pSVar1 = billboard_shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"u_translate",&local_d1);
  Shader::setUniform(pSVar1,&local_d0,0.0,0.0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pSVar1 = billboard_shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"u_modelViewProjectionMatrix",&local_f9);
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_13c,1.0);
  Shader::setUniform(pSVar1,&local_f8,&local_13c,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pSVar1 = billboard_shader;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"u_tex0",&local_161);
  Shader::setUniformTexture(pSVar1,&local_160,&local_10->super_Texture,0);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  Vbo::render(billboard_vbo,billboard_shader);
  return;
}

Assistant:

void image(const TextureStream *_stream) {
    if (billboard_shader == nullptr) {
        billboard_shader = new Shader();
        billboard_shader->setSource( getDefaultSrc(FRAG_DYNAMIC_BILLBOARD), getDefaultSrc(VERT_DYNAMIC_BILLBOARD) );
    }

    billboard_shader->use();
    billboard_shader->setUniform("u_depth", 0.0f);
    billboard_shader->setUniform("u_scale", 1.0f, 1.0f);
    billboard_shader->setUniform("u_translate", 0.0f, 0.0f);
    billboard_shader->setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0) );
    billboard_shader->setUniformTexture("u_tex0", _stream, 0);
    billboard_vbo->render( billboard_shader );
}